

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

CURLcode Curl_connect(Curl_easy *data,_Bool *asyncp,_Bool *protocol_done)

{
  undefined1 *puVar1;
  urlpieces *puVar2;
  char **ppcVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  char cVar7;
  _Bool _Var8;
  ushort uVar9;
  uint uVar10;
  CURLUcode CVar11;
  CURLcode CVar12;
  int iVar13;
  CURLcode CVar14;
  uchar *ch;
  size_t sVar15;
  size_t sVar16;
  connectdata *conn;
  ssl_backend_data *psVar17;
  ssl_backend_data *psVar18;
  char *pcVar19;
  CURLU *u;
  size_t sVar20;
  Curl_handler *pCVar21;
  char *pcVar22;
  long lVar23;
  ulong ulnum;
  connectbundle *bundle;
  connectdata *pcVar24;
  uint uVar25;
  uint uVar26;
  char *pcVar27;
  CURLcode CVar28;
  char *pcVar29;
  curl_proxytype proxytype;
  char **ppcVar30;
  bool bVar31;
  curltime cVar32;
  _Bool waitpipe;
  _Bool force_reuse;
  connectdata *conn_temp;
  char *newurl;
  _Bool local_f2;
  _Bool local_f1;
  char **local_f0;
  size_t local_e8;
  urlpieces *local_e0;
  size_t local_d8;
  _Bool *local_d0;
  _Bool *local_c8;
  connectdata *local_c0;
  char *local_b8 [17];
  
  conn = (connectdata *)0x0;
  *asyncp = false;
  local_c8 = protocol_done;
  Curl_free_request_state(data);
  memset(&data->req,0,0xe0);
  *(undefined4 *)&(data->req).size = 0xffffffff;
  *(undefined4 *)((long)&(data->req).size + 4) = 0xffffffff;
  *(undefined4 *)&(data->req).maxdownload = 0xffffffff;
  *(undefined4 *)((long)&(data->req).maxdownload + 4) = 0xffffffff;
  local_c0 = (connectdata *)0x0;
  local_f1 = false;
  local_f2 = false;
  sVar15 = Curl_multi_max_host_connections(data->multi);
  sVar16 = Curl_multi_max_total_connections(data->multi);
  *asyncp = false;
  local_d0 = asyncp;
  if ((data->state).url == (char *)0x0) {
    CVar12 = CURLE_URL_MALFORMAT;
    goto LAB_005f6abe;
  }
  local_e8 = sVar15;
  conn = (connectdata *)(*Curl_ccalloc)(1,0x588);
  if (conn == (connectdata *)0x0) {
LAB_005f64b2:
    conn = (connectdata *)0x0;
  }
  else {
    sVar15 = Curl_ssl->sizeof_ssl_backend_data;
    psVar17 = (ssl_backend_data *)(*Curl_ccalloc)(1,sVar15 * 4);
    if (psVar17 == (ssl_backend_data *)0x0) {
      (*Curl_cfree)(conn);
    }
    else {
      conn->ssl_extra = psVar17;
      conn->ssl[0].backend = psVar17;
      psVar18 = (ssl_backend_data *)((long)&psVar17->logger + sVar15);
      conn->ssl[1].backend = psVar18;
      psVar18 = (ssl_backend_data *)((long)&psVar18->logger + sVar15);
      conn->proxy_ssl[0].backend = psVar18;
      conn->proxy_ssl[1].backend = (ssl_backend_data *)((long)&psVar18->logger + sVar15);
    }
    uVar10 = 0;
    if (psVar17 == (ssl_backend_data *)0x0) goto LAB_005f64b2;
    conn->handler = &Curl_handler_dummy;
    conn->connection_id = -1;
    conn->port = -1;
    conn->remote_port = -1;
    conn->sock[0] = -1;
    conn->sock[1] = -1;
    conn->tempsock[0] = -1;
    conn->tempsock[1] = -1;
    Curl_conncontrol(conn,1);
    cVar32 = Curl_now();
    (conn->created).tv_sec = cVar32.tv_sec;
    (conn->created).tv_usec = cVar32.tv_usec;
    cVar32 = Curl_now();
    (conn->keepalive).tv_sec = cVar32.tv_sec;
    (conn->keepalive).tv_usec = cVar32.tv_usec;
    bVar4 = (data->set).proxytype;
    (conn->http_proxy).proxytype = bVar4;
    (conn->socks_proxy).proxytype = '\x04';
    pcVar19 = (data->set).str[0x15];
    if (pcVar19 != (char *)0x0) {
      uVar10 = (uint)(*pcVar19 != '\0') << 5;
    }
    uVar25 = *(uint *)&(conn->bits).field_0x4;
    uVar26 = (uint)(bVar4 < 3 && uVar10 != 0);
    *(uint *)&(conn->bits).field_0x4 =
         (uVar26 | uVar25 & 0xffffffdc) + (uint)(bVar4 >= 3 && uVar10 != 0) * 2 | uVar10;
    pcVar19 = (data->set).str[0x16];
    if ((pcVar19 != (char *)0x0) && (*pcVar19 != '\0')) {
      *(uint *)&(conn->bits).field_0x4 = uVar26 | uVar25 & 0xffffffde | 0x22;
    }
    uVar10 = (*(uint *)&(conn->bits).field_0x4 & 0xfffffffb) +
             (uint)((data->state).aptr.proxyuser != (char *)0x0) * 4;
    *(uint *)&(conn->bits).field_0x4 = uVar10;
    uVar25 = *(uint *)&(data->set).field_0x8e2 >> 3 & 8;
    *(uint *)&(conn->bits).field_0x4 = uVar10 & 0xfffffff7 | uVar25;
    uVar26 = (*(uint *)&(data->set).field_0x8e2 & 0x800) << 7;
    *(uint *)&(conn->bits).field_0x4 = uVar10 & 0xfffbfff7 | uVar25 | uVar26;
    *(uint *)&(conn->bits).field_0x4 =
         uVar10 & 0xfff3fff7 | uVar25 | uVar26 | (*(uint *)&(data->set).field_0x8e2 & 0x1000) << 7;
    bVar5 = (data->set).ssl.primary.field_0x71 & 4;
    bVar4 = (conn->ssl_config).field_0x71;
    (conn->ssl_config).field_0x71 = bVar4 & 0xfb | bVar5;
    bVar6 = (data->set).ssl.primary.field_0x71 & 1;
    (conn->ssl_config).field_0x71 = bVar4 & 0xfa | bVar5 | bVar6;
    (conn->ssl_config).field_0x71 =
         bVar4 & 0xf8 | bVar5 | bVar6 | (data->set).ssl.primary.field_0x71 & 2;
    (conn->ssl_config).ssl_options = (data->set).ssl.primary.ssl_options;
    bVar5 = (data->set).proxy_ssl.primary.field_0x71 & 4;
    bVar4 = (conn->proxy_ssl_config).field_0x71;
    (conn->proxy_ssl_config).field_0x71 = bVar4 & 0xfb | bVar5;
    bVar6 = (data->set).proxy_ssl.primary.field_0x71 & 1;
    (conn->proxy_ssl_config).field_0x71 = bVar4 & 0xfa | bVar5 | bVar6;
    (conn->proxy_ssl_config).field_0x71 =
         bVar4 & 0xf8 | bVar5 | bVar6 | (data->set).proxy_ssl.primary.field_0x71 & 2;
    (conn->proxy_ssl_config).ssl_options = (data->set).proxy_ssl.primary.ssl_options;
    conn->ip_version = (data->set).ipver;
    conn->connect_only = (data->set).connect_only;
    conn->transport = '\x03';
    Curl_llist_init(&conn->easyq,(Curl_llist_dtor)0x0);
    pcVar19 = (data->set).str[8];
    if (pcVar19 != (char *)0x0) {
      pcVar19 = (*Curl_cstrdup)(pcVar19);
      conn->localdev = pcVar19;
      if (pcVar19 == (char *)0x0) {
        Curl_llist_destroy(&conn->easyq,(void *)0x0);
        (*Curl_cfree)(conn->localdev);
        (*Curl_cfree)(conn->ssl_extra);
        (*Curl_cfree)(conn);
        goto LAB_005f64b2;
      }
    }
    conn->localportrange = (data->set).localportrange;
    conn->localport = (data->set).localport;
    conn->fclosesocket = (data->set).fclosesocket;
    conn->closesocket_client = (data->set).closesocket_client;
    cVar32 = Curl_now();
    (conn->lastused).tv_sec = cVar32.tv_sec;
    (conn->lastused).tv_usec = cVar32.tv_usec;
  }
  if (conn == (connectdata *)0x0) {
    CVar12 = CURLE_OUT_OF_MEMORY;
    goto LAB_005f64d6;
  }
  if ((data->set).uh == (CURLU *)0x0) {
    bVar31 = false;
  }
  else {
    bVar31 = ((data->state).field_0x6d0 & 2) == 0;
  }
  up_free(data);
  local_d8 = sVar16;
  if (bVar31) {
    u = curl_url_dup((data->set).uh);
  }
  else {
    u = curl_url();
  }
  (data->state).uh = u;
  CVar12 = CURLE_OUT_OF_MEMORY;
  if (u == (CURLU *)0x0) goto switchD_005f6a5d_caseD_1;
  if (((data->set).str[7] != (char *)0x0) &&
     (sVar15 = Curl_is_absolute_url((data->state).url,(char *)0x0,0,true), sVar15 == 0)) {
    pcVar19 = curl_maprintf("%s://%s",(data->set).str[7],(data->state).url);
    if (pcVar19 == (char *)0x0) goto switchD_005f6a5d_caseD_1;
    if (((data->state).field_0x6d2 & 2) != 0) {
      (*Curl_cfree)((data->state).url);
    }
    (data->state).url = pcVar19;
    puVar1 = &(data->state).field_0x6d2;
    *puVar1 = *puVar1 | 2;
  }
  CVar28 = CURLE_OUT_OF_MEMORY;
  if (bVar31) goto LAB_005f667c;
  uVar10 = (uint)((ulong)*(undefined8 *)&(data->set).field_0x8e2 >> 0x20);
  bVar31 = false;
  CVar11 = curl_url_set(u,CURLUPART_URL,(data->state).url,
                        (uVar10 >> 0xb & 0x20) + (uVar10 >> 5 & 0x10) + 0x208);
  CVar28 = CURLE_URL_MALFORMAT;
  switch(CVar11) {
  case CURLUE_OK:
    bVar31 = false;
    CVar11 = curl_url_get(u,CURLUPART_URL,local_b8,0);
    switch(CVar11) {
    case CURLUE_OK:
      if (((data->state).field_0x6d2 & 2) != 0) {
        (*Curl_cfree)((data->state).url);
      }
      (data->state).url = local_b8[0];
      puVar1 = &(data->state).field_0x6d2;
      *puVar1 = *puVar1 | 2;
      CVar28 = CURLE_OUT_OF_MEMORY;
      bVar31 = true;
      break;
    case CURLUE_UNSUPPORTED_SCHEME:
      goto switchD_005f65f3_caseD_5;
    case CURLUE_OUT_OF_MEMORY:
      goto switchD_005f65f3_caseD_7;
    case CURLUE_USER_NOT_ALLOWED:
      goto switchD_005f65f3_caseD_8;
    }
  default:
    goto switchD_005f65f3_caseD_1;
  case CURLUE_UNSUPPORTED_SCHEME:
switchD_005f65f3_caseD_5:
    CVar28 = CURLE_UNSUPPORTED_PROTOCOL;
    break;
  case CURLUE_OUT_OF_MEMORY:
switchD_005f65f3_caseD_7:
    CVar28 = CURLE_OUT_OF_MEMORY;
    break;
  case CURLUE_USER_NOT_ALLOWED:
switchD_005f65f3_caseD_8:
    CVar28 = CURLE_LOGIN_DENIED;
  }
  bVar31 = false;
switchD_005f65f3_caseD_1:
  CVar12 = CVar28;
  if (!bVar31) goto switchD_005f6a5d_caseD_1;
LAB_005f667c:
  puVar2 = &(data->state).up;
  CVar11 = curl_url_get(u,CURLUPART_SCHEME,&puVar2->scheme,0);
  switch(CVar11) {
  case CURLUE_OK:
    ppcVar30 = &(data->state).up.hostname;
    CVar11 = curl_url_get(u,CURLUPART_HOST,ppcVar30,0);
    if (CVar11 == CURLUE_OK) {
      sVar20 = strlen(*ppcVar30);
      if (sVar20 < 0x10000) goto LAB_005f6712;
      Curl_failf(data,"Too long host name (maximum is %d)",0xffff);
      goto switchD_005f66aa_caseD_1;
    }
    iVar13 = Curl_strcasecompare("file",puVar2->scheme);
    if (iVar13 != 0) {
LAB_005f6712:
      pcVar19 = *ppcVar30;
      local_e0 = puVar2;
      if (pcVar19 == (char *)0x0) {
        pcVar29 = (char *)0x0;
      }
      else {
        pcVar29 = pcVar19;
        if (*pcVar19 == '[') {
          puVar1 = &(conn->bits).field_0x5;
          *puVar1 = *puVar1 | 8;
          pcVar29 = pcVar19 + 1;
          sVar20 = strlen(pcVar29);
          pcVar19[sVar20] = '\0';
          zonefrom_url(u,data,conn);
        }
      }
      pcVar19 = "";
      if (pcVar29 != (char *)0x0) {
        pcVar19 = pcVar29;
      }
      pcVar19 = (*Curl_cstrdup)(pcVar19);
      puVar2 = local_e0;
      (conn->host).rawalloc = pcVar19;
      if (pcVar19 != (char *)0x0) {
        (conn->host).name = pcVar19;
        (conn->host).dispname = pcVar19;
        do {
          cVar7 = *pcVar19;
          pcVar19 = pcVar19 + 1;
        } while ('\0' < cVar7);
        if (cVar7 != '\0') {
          Curl_infof(data,"IDN support not present, can\'t parse Unicode domains");
        }
        if (((conn->bits).field_0x5 & 2) != 0) {
          pcVar19 = (conn->conn_to_host).name;
          (conn->conn_to_host).dispname = pcVar19;
          if (pcVar19 != (char *)0x0) {
            do {
              cVar7 = *pcVar19;
              pcVar19 = pcVar19 + 1;
            } while ('\0' < cVar7);
            if (cVar7 != '\0') {
              Curl_infof(data,"IDN support not present, can\'t parse Unicode domains");
            }
          }
        }
        if (((conn->bits).field_0x4 & 1) != 0) {
          pcVar19 = (conn->http_proxy).host.name;
          (conn->http_proxy).host.dispname = pcVar19;
          if (pcVar19 != (char *)0x0) {
            do {
              cVar7 = *pcVar19;
              pcVar19 = pcVar19 + 1;
            } while ('\0' < cVar7);
            if (cVar7 != '\0') {
              Curl_infof(data,"IDN support not present, can\'t parse Unicode domains");
            }
          }
        }
        if (((conn->bits).field_0x4 & 2) != 0) {
          pcVar19 = (conn->socks_proxy).host.name;
          (conn->socks_proxy).host.dispname = pcVar19;
          if (pcVar19 != (char *)0x0) {
            do {
              cVar7 = *pcVar19;
              pcVar19 = pcVar19 + 1;
            } while ('\0' < cVar7);
            if (cVar7 != '\0') {
              Curl_infof(data,"IDN support not present, can\'t parse Unicode domains");
            }
          }
        }
        pcVar19 = puVar2->scheme;
        pCVar21 = Curl_builtin_scheme(pcVar19,0xffffffffffffffff);
        if (((pCVar21 == (Curl_handler *)0x0) ||
            (((data->set).allowed_protocols & pCVar21->protocol) == 0)) ||
           ((((data->state).field_0x6d0 & 2) != 0 &&
            (((data->set).redir_protocols & pCVar21->protocol) == 0)))) {
          bVar31 = false;
          Curl_failf(data,"Protocol \"%s\" not supported or disabled in libcurl",pcVar19);
          CVar12 = CURLE_UNSUPPORTED_PROTOCOL;
        }
        else {
          conn->given = pCVar21;
          conn->handler = pCVar21;
          CVar12 = CURLE_OK;
          bVar31 = true;
        }
        if (!bVar31) break;
        ppcVar30 = &(data->state).aptr.passwd;
        CVar14 = CURLE_OK;
        if ((data->state).aptr.passwd == (char *)0x0) {
          ppcVar3 = &(data->state).up.password;
          local_f0 = ppcVar30;
          CVar11 = curl_url_get(u,CURLUPART_PASSWORD,ppcVar3,0);
          CVar14 = CURLE_OK;
          ppcVar30 = local_f0;
          CVar12 = CURLE_URL_MALFORMAT;
          switch(CVar11) {
          case CURLUE_UNSUPPORTED_SCHEME:
            goto switchD_005f66aa_caseD_5;
          case CURLUE_URLDECODE:
          case CURLUE_UNKNOWN_PART:
          case CURLUE_NO_SCHEME:
          case CURLUE_NO_USER:
            break;
          case CURLUE_OUT_OF_MEMORY:
            goto switchD_005f66aa_caseD_7;
          case CURLUE_USER_NOT_ALLOWED:
            goto switchD_005f66aa_caseD_8;
          case CURLUE_NO_PASSWORD:
            goto switchD_005f696e_caseD_c;
          default:
            if (CVar11 == CURLUE_OK) {
              bVar31 = false;
              CVar14 = Curl_urldecode(*ppcVar3,0,local_b8,(size_t *)0x0,
                                      ((conn->handler->flags >> 0xd & 1) != 0) + REJECT_CTRL);
              CVar12 = CVar14;
              if (CVar14 == CURLE_OK) {
                conn->passwd = local_b8[0];
                CVar14 = Curl_setstropt(local_f0,local_b8[0]);
                bVar31 = CVar14 == CURLE_OK;
                CVar12 = CVar28;
                if (!bVar31) {
                  CVar12 = CVar14;
                }
              }
              ppcVar30 = local_f0;
              if (bVar31) goto switchD_005f696e_caseD_c;
            }
          }
          break;
        }
switchD_005f696e_caseD_c:
        if ((data->set).str[0x2a] == (char *)0x0) {
          local_f0 = (char **)CONCAT44(local_f0._4_4_,CVar14);
          ppcVar3 = &(data->state).up.user;
          CVar11 = curl_url_get(u,CURLUPART_USER,ppcVar3,0);
          switch(CVar11) {
          case CURLUE_OK:
            CVar12 = Curl_urldecode(*ppcVar3,0,local_b8,(size_t *)0x0,
                                    ((conn->handler->flags >> 0xd & 1) != 0) + REJECT_CTRL);
            if (CVar12 != CURLE_OK) goto switchD_005f6a5d_caseD_1;
            conn->user = local_b8[0];
            CVar12 = Curl_setstropt(&(data->state).aptr.user,local_b8[0]);
            break;
          default:
            goto switchD_005f66aa_caseD_1;
          case CURLUE_UNSUPPORTED_SCHEME:
            goto switchD_005f66aa_caseD_5;
          case CURLUE_OUT_OF_MEMORY:
            goto switchD_005f66aa_caseD_7;
          case CURLUE_USER_NOT_ALLOWED:
            goto switchD_005f66aa_caseD_8;
          case CURLUE_NO_USER:
            CVar12 = (CURLcode)local_f0;
            if (*ppcVar30 != (char *)0x0) {
              CVar12 = Curl_setstropt(&(data->state).aptr.user,"");
            }
          }
          if (CVar12 != CURLE_OK) break;
        }
        ppcVar30 = &(data->state).up.options;
        CVar11 = curl_url_get(u,CURLUPART_OPTIONS,ppcVar30,0x40);
        switch(CVar11) {
        case CURLUE_UNSUPPORTED_SCHEME:
          goto switchD_005f66aa_caseD_5;
        case CURLUE_URLDECODE:
        case CURLUE_UNKNOWN_PART:
        case CURLUE_NO_SCHEME:
        case CURLUE_NO_USER:
        case CURLUE_NO_PASSWORD:
          goto switchD_005f66aa_caseD_1;
        case CURLUE_OUT_OF_MEMORY:
          break;
        case CURLUE_USER_NOT_ALLOWED:
          goto switchD_005f66aa_caseD_8;
        case CURLUE_NO_OPTIONS:
switchD_005f6928_caseD_d:
          CVar11 = curl_url_get(u,CURLUPART_PATH,&(data->state).up.path,0x80);
          CVar12 = CURLE_URL_MALFORMAT;
          switch(CVar11) {
          case CURLUE_OK:
            CVar11 = curl_url_get(u,CURLUPART_PORT,&(data->state).up.port,1);
            if (CVar11 == CURLUE_OK) {
              ulnum = strtoul((data->state).up.port,(char **)0x0,10);
              uVar9 = (data->set).use_port;
              if ((uVar9 == 0) || (((data->state).field_0x6d0 & 0x10) == 0)) {
                uVar9 = curlx_ultous(ulnum);
              }
              conn->remote_port = (uint)uVar9;
              conn->port = (uint)uVar9;
            }
            else {
              iVar13 = Curl_strcasecompare("file",local_e0->scheme);
              CVar12 = CURLE_OUT_OF_MEMORY;
              if (iVar13 == 0) break;
            }
            curl_url_get(u,CURLUPART_QUERY,&(data->state).up.query,0);
            uVar10 = (data->set).scope_id;
            CVar12 = CURLE_OK;
            if (uVar10 != 0) {
              conn->scope_id = uVar10;
              CVar12 = CURLE_OK;
            }
            break;
          case CURLUE_BAD_HANDLE:
          case CURLUE_BAD_PARTPOINTER:
          case CURLUE_MALFORMED_INPUT:
          case CURLUE_BAD_PORT_NUMBER:
          case CURLUE_URLDECODE:
            break;
          case CURLUE_UNSUPPORTED_SCHEME:
            goto switchD_005f66aa_caseD_5;
          case CURLUE_OUT_OF_MEMORY:
            goto switchD_005f66aa_caseD_7;
          case CURLUE_USER_NOT_ALLOWED:
            goto switchD_005f66aa_caseD_8;
          default:
            goto switchD_005f66aa_caseD_1;
          }
          goto switchD_005f6a5d_caseD_1;
        default:
          if (CVar11 != CURLUE_OK) goto switchD_005f66aa_caseD_1;
          pcVar19 = (*Curl_cstrdup)(*ppcVar30);
          conn->options = pcVar19;
          if (pcVar19 != (char *)0x0) goto switchD_005f6928_caseD_d;
        }
      }
    }
switchD_005f66aa_caseD_7:
    CVar12 = CURLE_OUT_OF_MEMORY;
    break;
  default:
switchD_005f66aa_caseD_1:
    CVar12 = CURLE_URL_MALFORMAT;
    break;
  case CURLUE_UNSUPPORTED_SCHEME:
switchD_005f66aa_caseD_5:
    CVar12 = CURLE_UNSUPPORTED_PROTOCOL;
    break;
  case CURLUE_OUT_OF_MEMORY:
    goto switchD_005f66aa_caseD_7;
  case CURLUE_USER_NOT_ALLOWED:
switchD_005f66aa_caseD_8:
    CVar12 = CURLE_LOGIN_DENIED;
  }
switchD_005f6a5d_caseD_1:
  if (CVar12 != CURLE_OK) goto LAB_005f6abe;
  pcVar19 = (data->set).str[0x46];
  if (pcVar19 != (char *)0x0) {
    pcVar19 = (*Curl_cstrdup)(pcVar19);
    conn->sasl_authzid = pcVar19;
    if (pcVar19 != (char *)0x0) goto LAB_005f6b64;
LAB_005f6c30:
    CVar12 = CURLE_OUT_OF_MEMORY;
    goto LAB_005f6abe;
  }
LAB_005f6b64:
  pcVar19 = (data->set).str[0x40];
  if (pcVar19 != (char *)0x0) {
    pcVar19 = (*Curl_cstrdup)(pcVar19);
    conn->oauth_bearer = pcVar19;
    if (pcVar19 == (char *)0x0) goto LAB_005f6c30;
  }
  if (((conn->bits).field_0x4 & 4) == 0) {
LAB_005f6c3a:
    pcVar19 = (data->set).str[0x15];
    if (pcVar19 == (char *)0x0) {
      pcVar19 = (char *)0x0;
    }
    else {
      pcVar19 = (*Curl_cstrdup)(pcVar19);
      if (pcVar19 == (char *)0x0) {
        Curl_failf(data,"memory shortage");
        CVar12 = CURLE_OUT_OF_MEMORY;
        goto LAB_005f6c70;
      }
    }
    pcVar29 = (data->set).str[0x16];
    if (pcVar29 == (char *)0x0) {
      pcVar29 = (char *)0x0;
    }
    else {
      pcVar29 = (*Curl_cstrdup)(pcVar29);
      if (pcVar29 == (char *)0x0) {
        pcVar29 = (char *)0x0;
        Curl_failf(data,"memory shortage");
        CVar12 = CURLE_OUT_OF_MEMORY;
        goto LAB_005f7056;
      }
    }
    if ((data->set).str[0x2f] == (char *)0x0) {
      pcVar27 = "no_proxy";
      pcVar22 = curl_getenv("no_proxy");
      if (pcVar22 == (char *)0x0) {
        pcVar27 = "NO_PROXY";
        pcVar22 = curl_getenv("NO_PROXY");
      }
      if (pcVar22 != (char *)0x0) {
        Curl_infof(data,"Uses proxy env variable %s == \'%s\'",pcVar27,pcVar22);
      }
    }
    else {
      pcVar22 = (char *)0x0;
    }
    pcVar27 = (data->set).str[0x2f];
    if (pcVar27 == (char *)0x0) {
      pcVar27 = pcVar22;
    }
    _Var8 = Curl_check_noproxy((conn->host).name,pcVar27);
    if (_Var8) {
      (*Curl_cfree)(pcVar19);
      (*Curl_cfree)(pcVar29);
      pcVar19 = (char *)0x0;
LAB_005f6e40:
      pcVar29 = (char *)0x0;
    }
    else if (pcVar19 == (char *)0x0 && pcVar29 == (char *)0x0) {
      pcVar19 = conn->handler->scheme;
      cVar7 = *pcVar19;
      if (cVar7 == '\0') {
        ppcVar30 = local_b8;
      }
      else {
        ppcVar30 = local_b8;
        do {
          pcVar19 = pcVar19 + 1;
          cVar7 = Curl_raw_tolower(cVar7);
          *(char *)ppcVar30 = cVar7;
          ppcVar30 = (char **)((long)ppcVar30 + 1);
          cVar7 = *pcVar19;
        } while (cVar7 != '\0');
      }
      builtin_strncpy((char *)((long)ppcVar30 + 3),"oxy",4);
      *(undefined4 *)ppcVar30 = 0x6f72705f;
      pcVar29 = (char *)local_b8;
      pcVar19 = curl_getenv(pcVar29);
      if (pcVar19 == (char *)0x0) {
        iVar13 = Curl_strcasecompare("http_proxy",(char *)local_b8);
        if (iVar13 == 0) {
          Curl_strntoupper((char *)local_b8,(char *)local_b8,0x80);
          pcVar19 = curl_getenv((char *)local_b8);
        }
        else {
          pcVar19 = (char *)0x0;
        }
      }
      if (pcVar19 == (char *)0x0) {
        pcVar29 = "all_proxy";
        pcVar19 = curl_getenv("all_proxy");
        if (pcVar19 == (char *)0x0) {
          pcVar29 = "ALL_PROXY";
          pcVar19 = curl_getenv("ALL_PROXY");
        }
      }
      if (pcVar19 != (char *)0x0) {
        Curl_infof(data,"Uses proxy env variable %s == \'%s\'",pcVar29,pcVar19);
      }
      goto LAB_005f6e40;
    }
    (*Curl_cfree)(pcVar22);
    if (pcVar19 == (char *)0x0) {
LAB_005f6e77:
      pcVar19 = (char *)0x0;
    }
    else if ((*pcVar19 == '\0') || ((conn->handler->flags & 0x10) != 0)) {
      (*Curl_cfree)(pcVar19);
      goto LAB_005f6e77;
    }
    if (pcVar29 == (char *)0x0) {
LAB_005f6ea3:
      pcVar29 = (char *)0x0;
    }
    else if ((*pcVar29 == '\0') || ((conn->handler->flags & 0x10) != 0)) {
      (*Curl_cfree)(pcVar29);
      goto LAB_005f6ea3;
    }
    if (pcVar19 == (char *)0x0 && pcVar29 == (char *)0x0) {
      puVar1 = &(conn->bits).field_0x4;
      *puVar1 = *puVar1 & 0xfc;
      pcVar29 = (char *)0x0;
      CVar12 = CURLE_OK;
LAB_005f7012:
      uVar10 = *(uint *)&(conn->bits).field_0x4;
      uVar25 = 0x20;
      if ((uVar10 & 1) == 0) {
        uVar25 = (uVar10 & 2) << 4;
      }
      *(uint *)&(conn->bits).field_0x4 = uVar10 & 0xffffffdf | uVar25;
      if (uVar25 == 0) {
        *(uint *)&(conn->bits).field_0x4 = uVar10 & 0xffffffd0;
        (conn->http_proxy).proxytype = '\0';
      }
    }
    else {
      proxytype = (curl_proxytype)(conn->http_proxy).proxytype;
      if (pcVar19 == (char *)0x0) {
LAB_005f6edf:
        if (pcVar29 != (char *)0x0) {
          CVar12 = parse_proxy(data,conn,pcVar29,proxytype);
          (*Curl_cfree)(pcVar29);
          if (CVar12 != CURLE_OK) {
            pcVar29 = (char *)0x0;
            goto LAB_005f6f0a;
          }
        }
        pcVar19 = (conn->http_proxy).host.rawalloc;
        if (pcVar19 == (char *)0x0) {
          uVar10 = *(uint *)&(conn->bits).field_0x4 & 0xfffffff6;
        }
        else {
          if ((conn->handler->protocol & 3) == 0) {
            if (((conn->handler->flags & 0x800) == 0) || (((conn->bits).field_0x4 & 8) != 0)) {
              puVar1 = &(conn->bits).field_0x4;
              *puVar1 = *puVar1 | 8;
            }
            else {
              conn->handler = &Curl_handler_http;
            }
          }
          uVar10 = *(uint *)&(conn->bits).field_0x4 | 1;
        }
        *(uint *)&(conn->bits).field_0x4 = uVar10;
        if ((conn->socks_proxy).host.rawalloc == (char *)0x0) {
          uVar10 = uVar10 & 0xfffffffd;
        }
        else {
          if ((pcVar19 == (char *)0x0) && ((conn->socks_proxy).user == (char *)0x0)) {
            pcVar19 = (conn->socks_proxy).passwd;
            (conn->socks_proxy).user = (conn->http_proxy).user;
            (conn->http_proxy).user = (char *)0x0;
            (*Curl_cfree)(pcVar19);
            (conn->socks_proxy).passwd = (conn->http_proxy).passwd;
            (conn->http_proxy).passwd = (char *)0x0;
          }
          uVar10 = *(uint *)&(conn->bits).field_0x4 | 2;
        }
        *(uint *)&(conn->bits).field_0x4 = uVar10;
        bVar31 = true;
        pcVar29 = (char *)0x0;
        CVar12 = CURLE_OK;
      }
      else {
        CVar12 = parse_proxy(data,conn,pcVar19,proxytype);
        (*Curl_cfree)(pcVar19);
        if (CVar12 == CURLE_OK) goto LAB_005f6edf;
LAB_005f6f0a:
        bVar31 = false;
      }
      if (bVar31) goto LAB_005f7012;
    }
    pcVar19 = (char *)0x0;
  }
  else {
    pcVar19 = (data->state).aptr.proxyuser;
    pcVar29 = (data->state).aptr.proxypasswd;
    if (pcVar19 == (char *)0x0) {
      pcVar19 = "";
    }
    if (pcVar29 == (char *)0x0) {
      pcVar29 = "";
    }
    ppcVar30 = &(conn->http_proxy).user;
    CVar12 = Curl_urldecode(pcVar19,0,ppcVar30,(size_t *)0x0,REJECT_ZERO);
    if (CVar12 == CURLE_OK) {
      CVar12 = Curl_setstropt(&(data->state).aptr.proxyuser,*ppcVar30);
    }
    if (CVar12 == CURLE_OK) {
      ppcVar30 = &(conn->http_proxy).passwd;
      CVar12 = Curl_urldecode(pcVar29,0,ppcVar30,(size_t *)0x0,REJECT_ZERO);
      if (CVar12 == CURLE_OK) {
        CVar12 = Curl_setstropt(&(data->state).aptr.proxypasswd,*ppcVar30);
      }
    }
    if (CVar12 == CURLE_OK) goto LAB_005f6c3a;
LAB_005f6c70:
    pcVar19 = (char *)0x0;
    pcVar29 = (char *)0x0;
  }
LAB_005f7056:
  (*Curl_cfree)(pcVar29);
  (*Curl_cfree)(pcVar19);
  if (CVar12 != CURLE_OK) goto LAB_005f6abe;
  if (((conn->given->flags & 1) != 0) &&
     (uVar10 = *(uint *)&(conn->bits).field_0x4, (uVar10 & 1) != 0)) {
    *(uint *)&(conn->bits).field_0x4 = uVar10 | 8;
  }
  uVar9 = (data->set).use_port;
  if ((uVar9 == 0) || (((data->state).field_0x6d0 & 0x10) == 0)) {
LAB_005f70f2:
    CVar12 = CURLE_OK;
    bVar31 = true;
  }
  else {
    conn->remote_port = (uint)uVar9;
    bVar31 = false;
    curl_msnprintf((char *)local_b8,0x10,"%d");
    CVar11 = curl_url_set((data->state).uh,CURLUPART_PORT,(char *)local_b8,0);
    CVar12 = CURLE_OUT_OF_MEMORY;
    if (CVar11 == CURLUE_OK) goto LAB_005f70f2;
  }
  if ((((!bVar31) || (CVar12 = override_login(data,conn), CVar12 != CURLE_OK)) ||
      (CVar12 = set_login(data,conn), CVar12 != CURLE_OK)) ||
     (CVar12 = parse_connect_to_slist(data,conn,(data->set).connect_to), CVar12 != CURLE_OK))
  goto LAB_005f6abe;
  if ((((conn->bits).field_0x5 & 2) != 0) &&
     (iVar13 = Curl_strcasecompare((conn->conn_to_host).name,(conn->host).name), iVar13 != 0)) {
    puVar1 = &(conn->bits).field_0x5;
    *puVar1 = *puVar1 & 0xfd;
  }
  uVar10 = *(uint *)&(conn->bits).field_0x4;
  if (((uVar10 >> 10 & 1) != 0) && (conn->conn_to_port == conn->remote_port)) {
    *(uint *)&(conn->bits).field_0x4 = uVar10 & 0xfffffbff;
  }
  uVar10 = *(uint *)&(conn->bits).field_0x4;
  if ((uVar10 & 1) != 0 && (uVar10 & 0x600) != 0) {
    *(uint *)&(conn->bits).field_0x4 = uVar10 | 8;
  }
  pCVar21 = conn->handler;
  if (pCVar21->setup_connection == (_func_CURLcode_Curl_easy_ptr_connectdata_ptr *)0x0) {
LAB_005f71e0:
    CVar12 = CURLE_OK;
    if (conn->port < 0) {
      conn->port = pCVar21->defport;
    }
  }
  else {
    CVar12 = (*pCVar21->setup_connection)(data,conn);
    if (CVar12 == CURLE_OK) {
      pCVar21 = conn->handler;
      goto LAB_005f71e0;
    }
  }
  if (CVar12 != CURLE_OK) goto LAB_005f6abe;
  conn->recv[0] = Curl_recv_plain;
  conn->send[0] = Curl_send_plain;
  conn->recv[1] = Curl_recv_plain;
  conn->send[1] = Curl_send_plain;
  *(uint *)&(conn->bits).field_0x4 =
       *(uint *)&(conn->bits).field_0x4 & 0xfdffffff |
       (uint)(*(ulong *)&(data->set).field_0x8e2 >> 0xe) & 0x2000000;
  if ((conn->handler->flags & 0x10) == 0) {
    pcVar19 = (data->set).str[0x1c];
    (data->set).ssl.primary.CApath = (data->set).str[0x1a];
    (data->set).ssl.primary.CAfile = pcVar19;
    (data->set).ssl.primary.issuercert = (data->set).str[0x27];
    (data->set).ssl.primary.issuercert_blob = (data->set).blobs[4];
    (data->set).ssl.primary.cipher_list = (data->set).str[0x20];
    (data->set).ssl.primary.cipher_list13 = (data->set).str[0x22];
    (data->set).ssl.primary.pinned_key = (data->set).str[0x1e];
    (data->set).ssl.primary.cert_blob = (data->set).blobs[0];
    (data->set).ssl.primary.ca_info_blob = (data->set).blobs[6];
    (data->set).ssl.primary.curves = (data->set).str[0x4b];
    pcVar19 = (data->set).str[0x1d];
    (data->set).proxy_ssl.primary.CApath = (data->set).str[0x1b];
    (data->set).proxy_ssl.primary.CAfile = pcVar19;
    (data->set).proxy_ssl.primary.cipher_list = (data->set).str[0x21];
    (data->set).proxy_ssl.primary.cipher_list13 = (data->set).str[0x23];
    (data->set).proxy_ssl.primary.pinned_key = (data->set).str[0x1f];
    (data->set).proxy_ssl.primary.cert_blob = (data->set).blobs[1];
    (data->set).proxy_ssl.primary.ca_info_blob = (data->set).blobs[7];
    (data->set).proxy_ssl.primary.issuercert = (data->set).str[0x28];
    (data->set).proxy_ssl.primary.issuercert_blob = (data->set).blobs[5];
    (data->set).proxy_ssl.primary.CRLfile = (data->set).str[0x26];
    (data->set).proxy_ssl.cert_type = (data->set).str[3];
    (data->set).proxy_ssl.key = (data->set).str[0xe];
    (data->set).proxy_ssl.key_type = (data->set).str[0x12];
    (data->set).proxy_ssl.key_passwd = (data->set).str[0x10];
    pcVar19 = (data->set).str[2];
    (data->set).proxy_ssl.primary.clientcert = (data->set).str[1];
    (data->set).proxy_ssl.key_blob = (data->set).blobs[3];
    (data->set).ssl.primary.CRLfile = (data->set).str[0x25];
    (data->set).ssl.cert_type = pcVar19;
    (data->set).ssl.key = (data->set).str[0xd];
    (data->set).ssl.key_type = (data->set).str[0x11];
    (data->set).ssl.key_passwd = (data->set).str[0xf];
    (data->set).ssl.primary.clientcert = (data->set).str[0];
    (data->set).ssl.key_blob = (data->set).blobs[2];
    _Var8 = Curl_clone_primary_ssl_config(&(data->set).ssl.primary,&conn->ssl_config);
    CVar12 = CURLE_OUT_OF_MEMORY;
    if ((!_Var8) ||
       (_Var8 = Curl_clone_primary_ssl_config
                          (&(data->set).proxy_ssl.primary,&conn->proxy_ssl_config), !_Var8))
    goto LAB_005f6abe;
    prune_dead_connections(data);
    if (((((data->set).field_0x8e5 & 0x40) == 0) || (((data->state).field_0x6d0 & 2) != 0)) &&
       (((data->set).connect_only == '\0' &&
        (_Var8 = ConnectionExists(data,conn,&local_c0,&local_f1,&local_f2), pcVar24 = local_c0,
        _Var8)))) {
      reuse_conn(data,conn,local_c0);
      pcVar19 = "proxy";
      if (((pcVar24->bits).field_0x4 & 0x20) == 0) {
        pcVar19 = "host";
      }
      lVar23 = 0xf0;
      if (((pcVar24->socks_proxy).host.name == (char *)0x0) &&
         (lVar23 = 0x130, (pcVar24->http_proxy).host.name == (char *)0x0)) {
        lVar23 = 0xa0;
      }
      Curl_infof(data,"Re-using existing connection #%ld with %s %s",pcVar24->connection_id,pcVar19,
                 *(undefined8 *)((pcVar24->chunk).hexbuffer + lVar23 + -0x3d));
      conn = pcVar24;
    }
    else {
      if (((conn->handler->flags & 0x100) != 0) && (((data->set).field_0x8e7 & 1) != 0)) {
        puVar1 = &(conn->bits).field_0x7;
        *puVar1 = *puVar1 | 4;
      }
      if (local_f2 == false) {
        bundle = Curl_conncache_find_bundle(data,conn,(data->state).conn_cache);
        if ((bundle == (connectbundle *)0x0 || local_e8 == 0) ||
           (bundle->num_connections < local_e8)) {
          bVar31 = true;
          if (data->share != (Curl_share *)0x0) {
            Curl_share_unlock(data,CURL_LOCK_DATA_CONNECT);
          }
        }
        else {
          pcVar24 = Curl_conncache_extract_bundle(data,bundle);
          if (data->share != (Curl_share *)0x0) {
            Curl_share_unlock(data,CURL_LOCK_DATA_CONNECT);
          }
          if (pcVar24 == (connectdata *)0x0) {
            bVar31 = false;
            Curl_infof(data,"No more connections allowed to host: %zu",local_e8);
          }
          else {
            Curl_disconnect(data,pcVar24,false);
            bVar31 = true;
          }
        }
      }
      else {
        bVar31 = false;
      }
      if (((bool)(local_d8 != 0 & bVar31)) &&
         (sVar15 = Curl_conncache_size(data), local_d8 <= sVar15)) {
        pcVar24 = Curl_conncache_extract_oldest(data);
        if (pcVar24 == (connectdata *)0x0) {
          bVar31 = false;
          Curl_infof(data,"No connections available in cache");
        }
        else {
          Curl_disconnect(data,pcVar24,false);
        }
      }
      if (!bVar31) {
        Curl_infof(data,"No connections available.");
        conn_free(conn);
        CVar12 = CURLE_NO_CONNECTION_AVAILABLE;
LAB_005f64d6:
        conn = (connectdata *)0x0;
        goto LAB_005f6abe;
      }
      Curl_attach_connection(data,conn);
      CVar12 = Curl_conncache_add_conn(data);
      if (CVar12 != CURLE_OK) goto LAB_005f6abe;
      if ((((data->state).authhost.picked & 0x28) != 0) &&
         (((data->state).authhost.field_0x18 & 1) != 0)) {
        Curl_infof(data,"NTLM picked AND auth done set, clear picked");
        (data->state).authhost.picked = 0;
        puVar1 = &(data->state).authhost.field_0x18;
        *puVar1 = *puVar1 & 0xfe;
      }
      if ((((data->state).authproxy.picked & 0x28) != 0) &&
         (((data->state).authproxy.field_0x18 & 1) != 0)) {
        Curl_infof(data,"NTLM-proxy picked AND auth done set, clear picked");
        (data->state).authproxy.picked = 0;
        puVar1 = &(data->state).authproxy.field_0x18;
        *puVar1 = *puVar1 & 0xfe;
      }
    }
    Curl_init_do(data,conn);
    CVar12 = setup_range(data);
    if (CVar12 == CURLE_OK) {
      conn->seek_func = (data->set).seek_func;
      conn->seek_client = (data->set).seek_client;
      CVar12 = resolve_server(data,conn,local_d0);
    }
    goto LAB_005f6abe;
  }
  Curl_persistconninfo(data,conn,(char *)0x0,-1);
  CVar12 = (*conn->handler->connect_it)(data,(_Bool *)local_b8);
  if (CVar12 == CURLE_OK) {
    (conn->bits).tcpconnect[0] = true;
    Curl_attach_connection(data,conn);
    CVar12 = Curl_conncache_add_conn(data);
    if (CVar12 != CURLE_OK) goto LAB_005f6abe;
    CVar12 = setup_range(data);
    if (CVar12 != CURLE_OK) {
      (*conn->handler->done)(data,CVar12,false);
      goto LAB_005f6abe;
    }
    CVar12 = CURLE_OK;
    Curl_setup_transfer(data,-1,-1,false,-1);
  }
  Curl_init_do(data,conn);
LAB_005f6abe:
  if (CVar12 == CURLE_OK) {
    if ((conn->easyq).size < 2) {
      CVar12 = CURLE_OK;
      if (*local_d0 == false) {
        CVar12 = Curl_setup_conn(data,local_c8);
      }
    }
    else {
      *local_c8 = true;
      CVar12 = CURLE_OK;
    }
  }
  if (((CVar12 != CURLE_NO_CONNECTION_AVAILABLE) && (conn != (connectdata *)0x0)) &&
     (CVar12 != CURLE_OK)) {
    Curl_detach_connection(data);
    Curl_conncache_remove_conn(data,conn,true);
    Curl_disconnect(data,conn,true);
  }
  return CVar12;
}

Assistant:

CURLcode Curl_connect(struct Curl_easy *data,
                      bool *asyncp,
                      bool *protocol_done)
{
  CURLcode result;
  struct connectdata *conn;

  *asyncp = FALSE; /* assume synchronous resolves by default */

  /* init the single-transfer specific data */
  Curl_free_request_state(data);
  memset(&data->req, 0, sizeof(struct SingleRequest));
  data->req.size = data->req.maxdownload = -1;

  /* call the stuff that needs to be called */
  result = create_conn(data, &conn, asyncp);

  if(!result) {
    if(CONN_INUSE(conn) > 1)
      /* multiplexed */
      *protocol_done = TRUE;
    else if(!*asyncp) {
      /* DNS resolution is done: that's either because this is a reused
         connection, in which case DNS was unnecessary, or because DNS
         really did finish already (synch resolver/fast async resolve) */
      result = Curl_setup_conn(data, protocol_done);
    }
  }

  if(result == CURLE_NO_CONNECTION_AVAILABLE) {
    return result;
  }
  else if(result && conn) {
    /* We're not allowed to return failure with memory left allocated in the
       connectdata struct, free those here */
    Curl_detach_connection(data);
    Curl_conncache_remove_conn(data, conn, TRUE);
    Curl_disconnect(data, conn, TRUE);
  }

  return result;
}